

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

BBox * __thiscall CMU462::Face::bounds(Face *this)

{
  bool bVar1;
  VertexCIter this_00;
  Face *in_RDI;
  BBox *in_stack_00000020;
  HalfedgeCIter h;
  BBox *box;
  Face *this_01;
  _Self local_30;
  HalfedgeCIter in_stack_ffffffffffffffd8;
  _Self local_18 [3];
  
  this_01 = in_RDI;
  BBox::BBox(in_stack_00000020);
  local_18[0]._M_node = (_List_node_base *)halfedge(in_RDI);
  do {
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)this_01);
    this_00 = Halfedge::vertex((Halfedge *)in_RDI);
    std::_List_const_iterator<CMU462::Vertex>::operator->
              ((_List_const_iterator<CMU462::Vertex> *)this_01);
    BBox::expand((BBox *)this_00._M_node,(Vector3D *)in_stack_ffffffffffffffd8._M_node);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)this_01);
    in_stack_ffffffffffffffd8 = Halfedge::next((Halfedge *)in_RDI);
    local_18[0]._M_node = in_stack_ffffffffffffffd8._M_node;
    local_30._M_node = (_List_node_base *)halfedge(in_RDI);
    bVar1 = std::operator!=(local_18,&local_30);
  } while (bVar1);
  return (BBox *)this_01;
}

Assistant:

BBox Face::bounds() const {
  BBox box;

  // grow the bounding box to contain
  // all vertices contained in this face
  HalfedgeCIter h = halfedge();
  do {
    box.expand(h->vertex()->position);
    h = h->next();
  } while (h != halfedge());

  return box;
}